

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O3

void keymacro_print(EditLine *el,wchar_t *key)

{
  keymacro_node_t **ppkVar1;
  wchar_t c;
  wchar_t *key_00;
  ssize_t sVar2;
  keymacro_node_t *pkVar3;
  keymacro_node_t *ptr;
  keymacro_node_t *pkVar4;
  wchar_t *pwVar5;
  size_t cnt;
  
  pkVar3 = (el->el_keymacro).map;
  if ((pkVar3 == (keymacro_node_t *)0x0) && (*key == L'\0')) {
    return;
  }
  *(el->el_keymacro).buf = L'\"';
  cnt = 1;
  pkVar4 = pkVar3;
  pwVar5 = key;
  do {
    while( true ) {
      if (pkVar4 == (keymacro_node_t *)0x0) goto LAB_0010befd;
      ptr = pkVar3;
      if ((pwVar5 == (wchar_t *)0x0) || (c = *pwVar5, ptr = pkVar4, c == L'\0')) {
        node_enum(el,ptr,cnt);
        return;
      }
      if (pkVar4->ch != c) break;
      sVar2 = ct_visual_char((el->el_keymacro).buf + cnt,0x400 - cnt,c);
      if (sVar2 == -1) goto LAB_0010befd;
      pkVar3 = pkVar4->next;
      pwVar5 = pwVar5 + 1;
      if (pkVar3 == (keymacro_node_t *)0x0) {
        if (*pwVar5 == L'\0') {
          key_00 = (el->el_keymacro).buf;
          pwVar5 = key_00 + sVar2 + cnt;
          pwVar5[0] = L'\"';
          pwVar5[1] = L'\0';
          keymacro_kprint(el,key_00,&pkVar4->val,pkVar4->type);
          return;
        }
        goto LAB_0010befd;
      }
      cnt = cnt + sVar2;
      pkVar4 = pkVar3;
    }
    ppkVar1 = &pkVar4->sibling;
    pkVar4 = *ppkVar1;
  } while (*ppkVar1 != (keymacro_node_t *)0x0);
LAB_0010befd:
  fprintf((FILE *)el->el_errfile,"Unbound extended key \"%ls\"\n",key);
  return;
}

Assistant:

libedit_private void
keymacro_print(EditLine *el, const wchar_t *key)
{

	/* do nothing if el->el_keymacro.map is empty and null key specified */
	if (el->el_keymacro.map == NULL && *key == 0)
		return;

	el->el_keymacro.buf[0] = '"';
	if (node_lookup(el, key, el->el_keymacro.map, (size_t)1) <= -1)
		/* key is not bound */
		(void) fprintf(el->el_errfile, "Unbound extended key \"%ls"
		    "\"\n", key);
	return;
}